

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O2

void __thiscall SymbolTable::SymbolTable(SymbolTable *this)

{
  u32 i;
  u64 *puVar1;
  long lVar2;
  u64 uVar3;
  u64 uVar4;
  
  uVar4 = 0;
  switchD_016d4fed::default(this->symbols,0,0x6002);
  this->suffixLim = 0x200;
  this->terminator = 0;
  this->zeroTerminated = false;
  puVar1 = &this->symbols[0].icl;
  for (uVar3 = 0x10000038; uVar3 != 0x11000038; uVar3 = uVar3 + 0x10000) {
    (((Symbol *)(puVar1 + -1))->val).num = uVar4;
    *puVar1 = uVar3;
    uVar4 = uVar4 + 1;
    puVar1 = puVar1 + 2;
  }
  for (lVar2 = 0; lVar2 != 0x1000; lVar2 = lVar2 + 0x10) {
    *(undefined8 *)((long)&this->symbols[0x100].val + lVar2) = 0;
    *(undefined8 *)((long)&this->symbols[0x100].icl + lVar2) = 0x11ff0038;
  }
  for (lVar2 = 0; lVar2 != 0x4000; lVar2 = lVar2 + 0x10) {
    *(undefined8 *)((long)&this->hashTab[0].val + lVar2) = 0;
    *(undefined8 *)((long)&this->hashTab[0].icl + lVar2) = 0xf1ff0000;
  }
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    this->byteCodes[lVar2] = (short)lVar2 + 0x1000;
  }
  for (lVar2 = 0; lVar2 != 0x10000; lVar2 = lVar2 + 1) {
    this->shortCodes[lVar2] = (ushort)lVar2 & 0xff | 0x1000;
  }
  this->lenHisto[0] = 0;
  this->lenHisto[1] = 0;
  this->lenHisto[2] = 0;
  this->lenHisto[3] = 0;
  this->lenHisto[4] = 0;
  this->lenHisto[5] = 0;
  this->lenHisto[6] = 0;
  this->lenHisto[7] = 0;
  this->lenHisto[8] = 0;
  return;
}

Assistant:

SymbolTable() : nSymbols(0), suffixLim(FSST_CODE_MAX), terminator(0), zeroTerminated(false) {
      // stuff done once at startup
      for (u32 i=0; i<256; i++) {
         symbols[i] = Symbol(i,i|(1<<FSST_LEN_BITS)); // pseudo symbols
      }
      Symbol unused = Symbol((u8) 0,FSST_CODE_MASK); // single-char symbol, exception code
      for (u32 i=256; i<FSST_CODE_MAX; i++) {
         symbols[i] = unused; // we start with all symbols unused
      }
      // empty hash table
      Symbol s;
      s.val.num = 0;
      s.icl = FSST_ICL_FREE; //marks empty in hashtab
      for(u32 i=0; i<hashTabSize; i++)
         hashTab[i] = s;

      // fill byteCodes[] with the pseudo code all bytes (escaped bytes)
      for(u32 i=0; i<256; i++)
         byteCodes[i] = (1<<FSST_LEN_BITS) | i;

      // fill shortCodes[] with the pseudo code for the first byte of each two-byte pattern
      for(u32 i=0; i<65536; i++)
         shortCodes[i] = (1<<FSST_LEN_BITS) | (i&255);

      memset(lenHisto, 0, sizeof(lenHisto)); // all unused
   }